

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O0

int __thiscall arbiter::Arbiter::copy(Arbiter *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  ArbiterError *pAVar5;
  reference pbVar6;
  ostream *poVar7;
  size_type sVar8;
  byte in_CL;
  char *pcVar9;
  string local_378;
  vector<char,_std::allocator<char>_> local_358;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  undefined1 local_2c0 [8];
  string subpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_260 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  int i;
  string local_220;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  Endpoint dstEndpoint;
  string commonPrefix;
  string local_158;
  Endpoint local_138;
  Endpoint *local_110;
  Endpoint *srcEndpoint;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string srcToResolve;
  string local_80;
  undefined1 local_5d;
  allocator local_49;
  string local_48;
  byte local_21;
  EVP_PKEY_CTX *pEStack_20;
  bool verbose_local;
  string *dst_local;
  string *src_local;
  Arbiter *this_local;
  
  local_21 = in_CL & 1;
  pEStack_20 = src;
  dst_local = (string *)dst;
  src_local = &this->m_config;
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    local_5d = 1;
    pAVar5 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"Cannot copy from empty source",&local_49);
    ArbiterError::ArbiterError(pAVar5,&local_48);
    local_5d = 0;
    __cxa_throw(pAVar5,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
  }
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    srcToResolve.field_2._M_local_buf[0xe] = '\x01';
    pAVar5 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_80,"Cannot copy to empty destination",
               (allocator *)(srcToResolve.field_2._M_local_buf + 0xf));
    ArbiterError::ArbiterError(pAVar5,&local_80);
    srcToResolve.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pAVar5,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
  }
  ::std::__cxx11::string::string((string *)&local_c8,(string *)dst);
  bVar1 = isDirectory(&local_c8);
  pcVar9 = "";
  if (bVar1) {
    pcVar9 = "**";
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst,pcVar9);
  ::std::__cxx11::string::~string((string *)&local_c8);
  pcVar9 = (char *)::std::__cxx11::string::back();
  if (*pcVar9 == '*') {
    ::std::__cxx11::string::string((string *)(commonPrefix.field_2._M_local_buf + 8),(string *)dst);
    stripPostfixing(&local_158,(string *)((long)&commonPrefix.field_2 + 8));
    getEndpoint(&local_138,this,&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)(commonPrefix.field_2._M_local_buf + 8));
    local_110 = &local_138;
    Endpoint::prefixedRoot_abi_cxx11_((string *)((long)&dstEndpoint.m_root.field_2 + 8),local_110);
    ::std::__cxx11::string::string((string *)&local_1e0,(string *)src);
    getEndpoint((Endpoint *)local_1c0,this,&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    Endpoint::prefixedRoot_abi_cxx11_(&local_200,local_110);
    Endpoint::prefixedRoot_abi_cxx11_(&local_220,(Endpoint *)local_1c0);
    _Var2 = ::std::operator==(&local_200,&local_220);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_200);
    if (_Var2) {
      paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pAVar5 = (ArbiterError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&i,"Cannot copy directory to itself",
                 (allocator *)
                 ((long)&paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      ArbiterError::ArbiterError(pAVar5,(string *)&i);
      paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pAVar5,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
    }
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    ::std::__cxx11::string::string((string *)&__range2,(string *)local_a8);
    resolve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_260,this,(string *)&__range2,(bool)(local_21 & 1));
    ::std::__cxx11::string::~string((string *)&__range2);
    __end2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_260);
    path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_260);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar1) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      subpath.field_2._8_8_ = pbVar6;
      ::std::__cxx11::string::size();
      ::std::__cxx11::string::substr((ulong)local_2c0,(ulong)pbVar6);
      if ((local_21 & 1) != 0) {
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)paths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        poVar7 = (ostream *)
                 ::std::ostream::operator<<
                           ((ostream *)&::std::cout,
                            (int)paths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar7 = ::std::operator<<(poVar7," / ");
        sVar8 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_260);
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,sVar8);
        poVar7 = ::std::operator<<(poVar7,": ");
        poVar7 = ::std::operator<<(poVar7,(string *)subpath.field_2._8_8_);
        poVar7 = ::std::operator<<(poVar7," -> ");
        Endpoint::prefixedFullPath(&local_2e0,(Endpoint *)local_1c0,(string *)local_2c0);
        poVar7 = ::std::operator<<(poVar7,(string *)&local_2e0);
        ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
        ::std::__cxx11::string::~string((string *)&local_2e0);
      }
      bVar1 = Endpoint::isLocal((Endpoint *)local_1c0);
      if (bVar1) {
        Endpoint::fullPath(&local_320,(Endpoint *)local_1c0,(string *)local_2c0);
        getDirname(&local_300,&local_320);
        mkdirp(&local_300);
        ::std::__cxx11::string::~string((string *)&local_300);
        ::std::__cxx11::string::~string((string *)&local_320);
      }
      ::std::__cxx11::string::string((string *)&local_340,(string *)local_2c0);
      ::std::__cxx11::string::string((string *)&local_378,(string *)subpath.field_2._8_8_);
      getBinary(&local_358,this,&local_378);
      Endpoint::put((Endpoint *)local_1c0,&local_340,&local_358);
      ::std::vector<char,_std::allocator<char>_>::~vector(&local_358);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_340);
      ::std::__cxx11::string::~string((string *)local_2c0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
    Endpoint::~Endpoint((Endpoint *)local_1c0);
    ::std::__cxx11::string::~string((string *)(dstEndpoint.m_root.field_2._M_local_buf + 8));
    Endpoint::~Endpoint(&local_138);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_e8,(string *)dst);
    ::std::__cxx11::string::string((string *)&srcEndpoint,(string *)src);
    copyFile(this,&local_e8,(string *)&srcEndpoint,(bool)(local_21 & 1));
    ::std::__cxx11::string::~string((string *)&srcEndpoint);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  iVar3 = ::std::__cxx11::string::~string((string *)local_a8);
  return iVar3;
}

Assistant:

void Arbiter::copy(
        const std::string src,
        const std::string dst,
        const bool verbose) const
{
    if (src.empty()) throw ArbiterError("Cannot copy from empty source");
    if (dst.empty()) throw ArbiterError("Cannot copy to empty destination");

    // Globify the source path if it's a directory.  In this case, the source
    // already ends with a slash.
    const std::string srcToResolve(src + (isDirectory(src) ? "**" : ""));

    if (srcToResolve.back() != '*')
    {
        // The source is a single file.
        copyFile(src, dst, verbose);
    }
    else
    {
        // We'll need this to mirror the directory structure in the output.
        // All resolved paths will contain this common prefix, so we can
        // determine any nested paths from recursive resolutions by stripping
        // that common portion.
        const Endpoint& srcEndpoint(getEndpoint(stripPostfixing(src)));
        const std::string commonPrefix(srcEndpoint.prefixedRoot());

        const Endpoint dstEndpoint(getEndpoint(dst));

        if (srcEndpoint.prefixedRoot() == dstEndpoint.prefixedRoot())
        {
            throw ArbiterError("Cannot copy directory to itself");
        }

        int i(0);
        const auto paths(resolve(srcToResolve, verbose));

        for (const auto& path : paths)
        {
            const std::string subpath(path.substr(commonPrefix.size()));

            if (verbose)
            {
                std::cout <<
                    ++i << " / " << paths.size() << ": " <<
                    path << " -> " << dstEndpoint.prefixedFullPath(subpath) <<
                    std::endl;
            }

            if (dstEndpoint.isLocal())
            {
                mkdirp(getDirname(dstEndpoint.fullPath(subpath)));
            }

            dstEndpoint.put(subpath, getBinary(path));
        }
    }
}